

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall kj::ArrayBuilder<const_char_*const>::dispose(ArrayBuilder<const_char_*const> *this)

{
  char **firstElement;
  RemoveConst<const_char_*const> *ppcVar1;
  char **ppcVar2;
  char **endCopy;
  char **posCopy;
  char **ptrCopy;
  ArrayBuilder<const_char_*const> *this_local;
  
  firstElement = this->ptr;
  ppcVar1 = this->pos;
  ppcVar2 = this->endPtr;
  if (firstElement != (char **)0x0) {
    this->ptr = (char **)0x0;
    this->pos = (RemoveConst<const_char_*const> *)0x0;
    this->endPtr = (char **)0x0;
    ArrayDisposer::dispose<char_const*const>
              (this->disposer,firstElement,(long)ppcVar1 - (long)firstElement >> 3,
               (long)ppcVar2 - (long)firstElement >> 3);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }